

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O3

void init_alsa_device(int argc,char **argv,size_t default_period_size,size_t default_buffer_size,
                     int mode,snd_pcm_t **out_device,size_t *out_period_size,uint *out_rate,
                     snd_pcm_format_t *out_format)

{
  undefined1 *alsabuffer;
  size_t sVar1;
  snd_pcm_format_t sVar2;
  snd_pcm_t *psVar3;
  xm_context_t *pxVar4;
  float *pfVar5;
  byte bVar6;
  uint8_t uVar7;
  _Bool _Var8;
  char cVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  ushort channel;
  int iVar12;
  uint extraout_EAX;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined4 extraout_var;
  time_t tVar17;
  size_t __len;
  char *pcVar18;
  char *pcVar19;
  float *pfVar20;
  char *pcVar21;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  char *unaff_RBX;
  ulong uVar26;
  float *pfVar27;
  char *unaff_RBP;
  long lVar28;
  char **ppcVar29;
  ulong uVar30;
  undefined2 uVar31;
  undefined4 in_register_00000084;
  long lVar32;
  ulong uVar33;
  char **unaff_R13;
  ulong uVar34;
  char *unaff_R14;
  char *unaff_R15;
  bool loopcnt;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar35;
  float fVar36;
  snd_pcm_t *device;
  size_t buffer_size;
  ulong auStackY_250 [7];
  undefined8 uStack_200;
  float fStack_1f8;
  undefined2 uStack_1f3;
  undefined4 uStack_1f1;
  undefined2 uStack_1ed;
  size_t sStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  undefined1 *puStack_190;
  ulong uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  undefined1 *puStack_170;
  snd_pcm_t *psStack_168;
  size_t sStack_160;
  float *pfStack_158;
  ulong uStack_150;
  uint uStack_148;
  snd_pcm_format_t sStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  float fStack_130;
  float fStack_12c;
  ulong uStack_128;
  ulong uStack_120;
  uint64_t uStack_118;
  ulong uStack_110;
  snd_pcm_t *psStack_108;
  ulong uStack_100;
  ushort uStack_f4;
  ushort uStack_f2;
  uint uStack_f0;
  float fStack_ec;
  ulong uStack_e8;
  uint16_t uStack_da;
  ulong uStack_d8;
  char **ppcStack_d0;
  byte bStack_c2;
  byte bStack_c1;
  xm_context_t *pxStack_c0;
  byte bStack_b1;
  ulong uStack_b0;
  char *pcStack_a8;
  char **ppcStack_a0;
  char *pcStack_98;
  char *pcStack_90;
  code *pcStack_88;
  code *pcStack_80;
  snd_pcm_t *local_78;
  undefined8 local_70;
  snd_pcm_format_t local_64;
  size_t local_60;
  size_t local_58;
  char **local_50;
  char *local_48;
  uint local_3c;
  snd_pcm_t **local_38;
  
  lVar32 = CONCAT44(in_register_00000084,mode);
  local_60 = default_period_size;
  local_58 = default_buffer_size;
  local_3c = mode;
  local_38 = out_device;
  if ((uint)argc < 2) {
    local_64 = SND_PCM_FORMAT_FLOAT;
    local_50 = (char **)0xbb80;
    local_48 = "default";
    argv = unaff_R13;
  }
  else {
    unaff_R15 = (char *)(long)argc;
    local_48 = "default";
    local_50 = (char **)0xbb80;
    local_64 = SND_PCM_FORMAT_FLOAT;
    unaff_RBX = "--device";
    pcVar18 = (char *)0x1;
    do {
      unaff_R14 = argv[(long)pcVar18];
      if (((*unaff_R14 == '-') && (unaff_R14[1] == '-')) && (unaff_R14[2] == '\0')) break;
      pcStack_80 = (code *)0x1030d0;
      iVar12 = strcmp(unaff_R14,"--device");
      if (iVar12 == 0) {
        if (pcVar18 + 1 == unaff_R15) {
          pcStack_80 = (code *)0x103619;
          init_alsa_device_cold_6();
LAB_00103619:
          pcStack_80 = (code *)0x103624;
          init_alsa_device_cold_5();
LAB_00103624:
          pcStack_80 = (code *)0x10362f;
          init_alsa_device_cold_2();
LAB_0010362f:
          pcStack_80 = (code *)0x10363a;
          init_alsa_device_cold_4();
LAB_0010363a:
          pcStack_80 = (code *)0x103645;
          init_alsa_device_cold_3();
LAB_00103645:
          unaff_RBP = pcVar18 + 1;
          pcStack_80 = (code *)0x103650;
          pcVar19 = unaff_R14;
          init_alsa_device_cold_1();
          iVar12 = (int)pcVar19;
          goto LAB_00103650;
        }
        local_48 = argv[(long)(pcVar18 + 1)];
      }
      else {
        pcStack_80 = (code *)0x1030e7;
        iVar12 = strcmp(unaff_R14,"--buffer-size");
        if (iVar12 == 0) {
          if (pcVar18 + 1 == unaff_R15) goto LAB_00103619;
          pcStack_80 = (code *)0x1031cf;
          local_58 = strtol(argv[(long)(pcVar18 + 1)],(char **)0x0,0);
        }
        else {
          pcStack_80 = (code *)0x1030fe;
          iVar12 = strcmp(unaff_R14,"--period-size");
          if (iVar12 == 0) {
            if (pcVar18 + 1 != unaff_R15) {
              pcStack_80 = (code *)0x1031f2;
              local_60 = strtol(argv[(long)(pcVar18 + 1)],(char **)0x0,0);
              goto LAB_0010322e;
            }
            goto LAB_0010362f;
          }
          pcStack_80 = (code *)0x103115;
          iVar12 = strcmp(unaff_R14,"--rate");
          if (iVar12 == 0) {
            if (pcVar18 + 1 != unaff_R15) {
              pcStack_80 = (code *)0x103215;
              local_50 = (char **)strtol(argv[(long)(pcVar18 + 1)],(char **)0x0,0);
              goto LAB_0010322e;
            }
            goto LAB_0010363a;
          }
          pcStack_80 = (code *)0x10312c;
          iVar12 = strcmp(unaff_R14,"--format");
          if (iVar12 != 0) break;
          if (pcVar18 + 1 == unaff_R15) goto LAB_00103624;
          unaff_R14 = argv[(long)(pcVar18 + 1)];
          pcStack_80 = (code *)0x103156;
          iVar12 = strcmp(unaff_R14,"float");
          if (iVar12 == 0) {
            local_64 = SND_PCM_FORMAT_FLOAT;
          }
          else {
            pcStack_80 = (code *)0x10316d;
            iVar12 = strcmp(unaff_R14,"s16");
            if (iVar12 == 0) {
              local_64 = SND_PCM_FORMAT_S16;
            }
            else {
              pcStack_80 = (code *)0x103184;
              iVar12 = strcmp(unaff_R14,"s32");
              local_64 = SND_PCM_FORMAT_S32;
              if (iVar12 != 0) goto LAB_00103645;
            }
          }
        }
      }
LAB_0010322e:
      unaff_RBP = pcVar18 + 2;
      pcVar18 = unaff_RBP;
    } while (unaff_RBP < unaff_R15);
  }
  pcVar18 = local_48;
  default_buffer_size = (size_t)local_3c;
  pcStack_80 = (code *)0x103273;
  iVar12 = snd_pcm_open(&local_78,local_48,0);
  if (iVar12 < 0) {
    pcStack_80 = (code *)0x103284;
    iVar13 = snd_pcm_recover(local_78,iVar12,0);
    if (-1 < iVar13) goto LAB_0010328c;
LAB_00103650:
    pcStack_80 = (code *)0x103657;
    init_alsa_device_cold_21();
LAB_00103657:
    pcStack_80 = (code *)0x10365e;
    init_alsa_device_cold_20();
LAB_0010365e:
    pcStack_80 = (code *)0x103665;
    init_alsa_device_cold_19();
LAB_00103665:
    pcStack_80 = (code *)0x10366c;
    init_alsa_device_cold_18();
LAB_0010366c:
    pcStack_80 = (code *)0x103673;
    init_alsa_device_cold_15();
LAB_00103673:
    pcStack_80 = (code *)0x10367a;
    init_alsa_device_cold_14();
LAB_0010367a:
    pcStack_80 = (code *)0x103681;
    init_alsa_device_cold_13();
LAB_00103681:
    pcStack_80 = (code *)0x103688;
    init_alsa_device_cold_12();
LAB_00103688:
    pcStack_80 = (code *)0x10368f;
    init_alsa_device_cold_11();
LAB_0010368f:
    pcStack_80 = (code *)0x103696;
    init_alsa_device_cold_10();
LAB_00103696:
    pcStack_80 = (code *)0x10369d;
    init_alsa_device_cold_9();
LAB_0010369d:
    pcStack_80 = (code *)0x1036a4;
    init_alsa_device_cold_8();
LAB_001036a4:
    pcStack_80 = (code *)0x1036ab;
    init_alsa_device_cold_7();
LAB_001036ab:
    pcStack_80 = (code *)0x1036b2;
    init_alsa_device_cold_16();
    uVar14 = extraout_EAX;
  }
  else {
LAB_0010328c:
    pcStack_80 = (code *)0x103296;
    iVar12 = snd_pcm_hw_params_malloc(&local_70);
    argv = local_50;
    if (iVar12 < 0) {
      pcStack_80 = (code *)0x1032ac;
      iVar13 = snd_pcm_recover(local_78,iVar12,0);
      if (iVar13 < 0) goto LAB_00103657;
    }
    pcStack_80 = (code *)0x1032c2;
    iVar12 = snd_pcm_hw_params_any(local_78,local_70);
    if (iVar12 < 0) {
      pcStack_80 = (code *)0x1032d3;
      iVar13 = snd_pcm_recover(local_78,iVar12,0);
      if (iVar13 < 0) goto LAB_0010365e;
    }
    pcStack_80 = (code *)0x1032ee;
    iVar12 = snd_pcm_hw_params_set_access(local_78,local_70,3);
    if (iVar12 < 0) {
      pcStack_80 = (code *)0x1032ff;
      iVar13 = snd_pcm_recover(local_78,iVar12,0);
      if (iVar13 < 0) goto LAB_00103665;
    }
    pcStack_80 = (code *)0x103319;
    iVar12 = snd_pcm_hw_params_set_format(local_78,local_70,local_64);
    if (-1 < iVar12) {
LAB_0010338f:
      default_buffer_size = 0;
      pcStack_80 = (code *)0x1033a2;
      iVar12 = snd_pcm_hw_params_set_rate(local_78,local_70,(ulong)argv & 0xffffffff);
      if (-1 < iVar12) {
LAB_001033f9:
        pcStack_80 = (code *)0x10340c;
        iVar12 = snd_pcm_hw_params_set_channels(local_78,local_70,2);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x10341d;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_0010366c;
        }
        pcStack_80 = (code *)0x103438;
        iVar12 = snd_pcm_hw_params_set_buffer_size_near(local_78,local_70,&local_58);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x103449;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_00103673;
        }
        default_buffer_size = 0;
        pcStack_80 = (code *)0x103466;
        iVar12 = snd_pcm_hw_params_set_period_size_near(local_78,local_70,&local_60);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x103477;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_0010367a;
        }
        pcStack_80 = (code *)0x10348d;
        iVar12 = snd_pcm_hw_params(local_78,local_70);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x10349e;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_00103681;
        }
        unaff_RBX = (char *)&local_70;
        pcStack_80 = (code *)0x1034b3;
        snd_pcm_hw_params_free(local_70);
        pcStack_80 = (code *)0x1034bb;
        iVar12 = snd_pcm_sw_params_malloc(unaff_RBX);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x1034cc;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_00103688;
        }
        pcStack_80 = (code *)0x1034e2;
        iVar12 = snd_pcm_sw_params_current(local_78,local_70);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x1034f3;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_0010368f;
        }
        pcStack_80 = (code *)0x103513;
        iVar12 = snd_pcm_sw_params_set_start_threshold(local_78,local_70,local_58 - local_60);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x103524;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_00103696;
        }
        pcStack_80 = (code *)0x10353f;
        iVar12 = snd_pcm_sw_params_set_avail_min(local_78,local_70,local_60);
        if (iVar12 < 0) {
          pcStack_80 = (code *)0x103550;
          iVar13 = snd_pcm_recover(local_78,iVar12,0);
          if (iVar13 < 0) goto LAB_0010369d;
        }
        pcStack_80 = (code *)0x103566;
        iVar12 = snd_pcm_sw_params(local_78,local_70);
        if (-1 < iVar12) {
LAB_0010357f:
          pcStack_80 = (code *)0x1035a1;
          snd_pcm_sw_params_free(local_70);
          sVar2 = local_64;
          pcVar19 = "s16";
          if (local_64 == SND_PCM_FORMAT_S32) {
            pcVar19 = "s32";
          }
          pcVar21 = "float";
          if (local_64 != SND_PCM_FORMAT_FLOAT) {
            pcVar21 = pcVar19;
          }
          pcStack_80 = (code *)0x1035e6;
          printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",pcVar18,pcVar21,
                 (ulong)argv & 0xffffffff,local_60,local_58);
          *local_38 = local_78;
          *out_period_size = local_60;
          *out_rate = (uint)argv;
          *out_format = sVar2;
          return;
        }
        pcStack_80 = (code *)0x103577;
        iVar13 = snd_pcm_recover(local_78,iVar12,0);
        if (-1 < iVar13) goto LAB_0010357f;
        goto LAB_001036a4;
      }
      argv = (char **)0xbb80;
      default_buffer_size = 0;
      pcStack_80 = (code *)0x1033c1;
      iVar12 = snd_pcm_hw_params_set_rate(local_78,local_70,48000);
      if (-1 < iVar12) goto LAB_001033f9;
      argv = (char **)0xac44;
      default_buffer_size = 0;
      pcStack_80 = (code *)0x1033e0;
      iVar12 = snd_pcm_hw_params_set_rate(local_78,local_70,0xac44);
      if (-1 < iVar12) goto LAB_001033f9;
      pcStack_80 = (code *)0x1033f1;
      iVar13 = snd_pcm_recover(local_78,iVar12,0);
      if (-1 < iVar13) goto LAB_001033f9;
      goto LAB_001036ab;
    }
    local_64 = SND_PCM_FORMAT_FLOAT;
    pcStack_80 = (code *)0x103338;
    iVar12 = snd_pcm_hw_params_set_format(local_78,local_70,0xe);
    if (-1 < iVar12) goto LAB_0010338f;
    local_64 = SND_PCM_FORMAT_S32;
    pcStack_80 = (code *)0x103357;
    iVar12 = snd_pcm_hw_params_set_format(local_78,local_70,10);
    if (-1 < iVar12) goto LAB_0010338f;
    local_64 = SND_PCM_FORMAT_S16;
    pcStack_80 = (code *)0x103376;
    iVar12 = snd_pcm_hw_params_set_format(local_78,local_70,2);
    if (-1 < iVar12) goto LAB_0010338f;
    pcStack_80 = (code *)0x103387;
    uVar14 = snd_pcm_recover(local_78,iVar12,0);
    if (-1 < (int)uVar14) goto LAB_0010338f;
  }
  uVar34 = (ulong)uVar14;
  pcStack_80 = play_floatbuffer;
  init_alsa_device_cold_17();
  lVar22 = extraout_RDX;
  fVar35 = extraout_XMM0_Da;
  pcStack_80 = (code *)unaff_RBX;
  if (((iVar12 == 0xe) && (extraout_XMM0_Da == 1.0)) && (!NAN(extraout_XMM0_Da))) {
    pcStack_88 = (code *)0x1036d8;
    iVar12 = snd_pcm_writei(uVar34,default_buffer_size);
    if (-1 < iVar12) {
      return;
    }
    pcStack_88 = (code *)0x1036ec;
    iVar13 = snd_pcm_recover(uVar34,iVar12,0);
    if (-1 < iVar13) {
      return;
    }
    pcStack_88 = (code *)0x1036fb;
    play_floatbuffer_cold_2();
    lVar22 = extraout_RDX_00;
    fVar35 = extraout_XMM0_Da_00;
  }
  if (iVar12 == 2) {
    if (lVar22 * 2 != 0) {
      lVar28 = 0;
      do {
        fVar36 = *(float *)(default_buffer_size + lVar28 * 4) * fVar35;
        uVar31 = 0x7fff;
        if ((fVar36 <= 1.0) && (uVar31 = 0x8001, -1.0 <= fVar36)) {
          uVar31 = (undefined2)(int)(fVar36 * 32767.0);
        }
        *(undefined2 *)(lVar32 + lVar28 * 2) = uVar31;
        lVar28 = lVar28 + 1;
      } while (lVar22 * 2 != lVar28);
    }
  }
  else if (iVar12 == 10) {
    if (lVar22 * 2 != 0) {
      lVar28 = 0;
      do {
        fVar36 = *(float *)(default_buffer_size + lVar28 * 4) * fVar35;
        iVar12 = 0x7fffffff;
        if ((fVar36 <= 1.0) && (iVar12 = -0x7fffffff, -1.0 <= fVar36)) {
          iVar12 = (int)(fVar36 * 2.1474836e+09);
        }
        *(int *)(lVar32 + lVar28 * 4) = iVar12;
        lVar28 = lVar28 + 1;
      } while (lVar22 * 2 != lVar28);
    }
  }
  else if ((iVar12 == 0xe) && (lVar22 * 2 != 0)) {
    lVar28 = 0;
    do {
      *(float *)(lVar32 + lVar28 * 4) = *(float *)(default_buffer_size + lVar28 * 4) * fVar35;
      lVar28 = lVar28 + 1;
    } while (lVar22 * 2 != lVar28);
  }
  pcStack_88 = (code *)0x1037fc;
  uVar14 = snd_pcm_writei(uVar34,lVar32);
  if (-1 < (int)uVar14) {
    return;
  }
  ppcVar29 = (char **)(ulong)uVar14;
  pcStack_88 = (code *)0x10380c;
  uVar14 = snd_pcm_recover(uVar34,ppcVar29,0);
  if (-1 < (int)uVar14) {
    return;
  }
  pcStack_88 = main;
  play_floatbuffer_cold_1();
  pfVar20 = &fStack_1f8;
  pfVar27 = &fStack_1f8;
  uStack_118 = 0;
  pfVar5 = &fStack_1f8;
  uStack_b0 = uVar34;
  pcStack_a8 = pcVar18;
  ppcStack_a0 = argv;
  pcStack_98 = unaff_R14;
  pcStack_90 = unaff_R15;
  pcStack_88 = (code *)unaff_RBP;
  if (uVar14 != 1) {
    pcVar18 = ppcVar29[1];
    if (((*pcVar18 != '-') || (pcVar18[1] != 'h')) || (pfVar5 = &fStack_1f8, pcVar18[2] != '\0')) {
      uStack_200 = 0x10386d;
      ppcStack_d0 = ppcVar29;
      iVar12 = strcmp(pcVar18,"--help");
      pfVar5 = &fStack_1f8;
      if (iVar12 != 0) {
        uStack_100 = (ulong)(int)uVar14;
        if (uVar14 == 0) {
          fStack_ec = 1.0;
          uVar16 = 1;
          uVar34 = 1;
          iVar12 = 0;
        }
        else {
          uVar34 = 1;
          fStack_ec = 1.0;
          uStack_d8 = 0;
          uVar16 = 1;
          uStack_e8 = (ulong)uVar14;
          do {
            pcVar18 = ppcStack_d0[uVar16];
            if (((*pcVar18 == '-') && (pcVar18[1] == '-')) && (pcVar18[2] == '\0')) {
              uVar16 = uVar16 + 1;
              goto LAB_001039ed;
            }
            uStack_200 = 0x1038e2;
            iVar12 = strcmp(pcVar18,"--preamp");
            if (iVar12 == 0) {
              uVar26 = uVar16 + 1;
              if (uVar26 == uStack_100) goto LAB_001043c6;
              uStack_200 = 0x103998;
              fStack_ec = strtof(ppcStack_d0[uVar16 + 1],(char **)0x0);
            }
            else {
              uStack_200 = 0x1038f5;
              iVar12 = strcmp(pcVar18,"--loop");
              if (iVar12 == 0) {
                uVar26 = uVar16 + 1;
                if (uVar26 == uStack_100) goto LAB_001043e7;
                uStack_200 = 0x1039c1;
                uVar34 = strtol(ppcStack_d0[uVar16 + 1],(char **)0x0,0);
              }
              else {
                uStack_200 = 0x10390c;
                iVar12 = strcmp(pcVar18,"--random");
                if (iVar12 == 0) {
                  uStack_d8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar12) >> 8),1);
                  uVar26 = uVar16;
                }
                else {
                  uStack_200 = 0x103923;
                  iVar12 = strcmp(pcVar18,"--device");
                  if (iVar12 != 0) {
                    uStack_200 = 0x103936;
                    iVar12 = strcmp(pcVar18,"--buffer-size");
                    if (iVar12 != 0) {
                      uStack_200 = 0x103949;
                      iVar12 = strcmp(pcVar18,"--period-size");
                      if (iVar12 != 0) {
                        uStack_200 = 0x10395c;
                        iVar12 = strcmp(pcVar18,"--rate");
                        if (iVar12 != 0) {
                          uStack_200 = 0x10396f;
                          iVar12 = strcmp(pcVar18,"--format");
                          if (iVar12 != 0) goto LAB_001039e6;
                        }
                      }
                    }
                  }
                  uVar26 = uVar16 + 1;
                }
              }
            }
            uVar16 = uVar26 + 1;
          } while (uVar16 < uStack_100);
          uVar16 = 1;
LAB_001039e6:
LAB_001039ed:
          iVar12 = (int)uStack_e8;
          if (((byte)uStack_d8 & 1) != 0) {
            uStack_200 = 0x1039fa;
            tVar17 = time((time_t *)0x0);
            uStack_200 = 0x103a01;
            srand((uint)tVar17);
            ppcVar29 = ppcStack_d0;
            uVar26 = (ulong)(iVar12 + -1);
            if (uVar16 < uVar26) {
              do {
                uStack_200 = 0x103a23;
                iVar12 = rand();
                uVar23 = (ulong)(long)iVar12 % ((1 - uVar16) + uVar26);
                pcVar18 = ppcStack_d0[uVar26];
                ppcStack_d0[uVar26] = ppcVar29[uVar16 + uVar23];
                ppcVar29[uVar16 + uVar23] = pcVar18;
                uVar26 = uVar26 - 1;
              } while (uVar16 < uVar26);
              iVar12 = (int)uStack_e8;
            }
          }
        }
        auStackY_250[6] = 0x103aa6;
        init_alsa_device(iVar12,ppcStack_d0,0x80,0x400,0,&psStack_168,&sStack_1b0,&uStack_148,
                         &sStack_144);
        sStack_160 = sStack_1b0;
        uVar26 = sStack_1b0 * 8 + 0xf & 0xfffffffffffffff0;
        pfStack_158 = (float *)((long)&fStack_1f8 - uVar26);
        pfVar20 = (float *)((long)pfStack_158 - uVar26);
        puStack_190 = (undefined1 *)pfVar20;
        puStack_170 = (undefined1 *)&fStack_1f8;
        *(undefined8 *)((long)pfVar20 + -8) = 0x103af5;
        tcgetattr(0,(termios *)&previousflags);
        *(undefined8 *)((long)pfVar20 + -8) = 0x103b01;
        atexit(restoreterm);
        customflags.c_iflag = previousflags.c_iflag;
        customflags.c_oflag = previousflags.c_oflag;
        customflags.c_line = previousflags.c_line;
        customflags.c_cc[0] = previousflags.c_cc[0];
        customflags.c_cc[1] = previousflags.c_cc[1];
        customflags.c_cc[2] = previousflags.c_cc[2];
        customflags.c_cc[3] = previousflags.c_cc[3];
        customflags.c_cc[4] = previousflags.c_cc[4];
        customflags.c_cc[5] = previousflags.c_cc[5];
        customflags.c_cc[6] = previousflags.c_cc[6];
        customflags.c_cc[7] = previousflags.c_cc[7];
        customflags.c_cc[8] = previousflags.c_cc[8];
        customflags.c_cc[9] = previousflags.c_cc[9];
        customflags.c_cc[10] = previousflags.c_cc[10];
        customflags.c_cc[0xb] = previousflags.c_cc[0xb];
        customflags.c_cc[0xc] = previousflags.c_cc[0xc];
        customflags.c_cc[0xd] = previousflags.c_cc[0xd];
        customflags.c_cc[0xe] = previousflags.c_cc[0xe];
        customflags.c_cc[0xf] = previousflags.c_cc[0xf];
        customflags.c_cc[0x10] = previousflags.c_cc[0x10];
        customflags.c_cc[0x11] = previousflags.c_cc[0x11];
        customflags.c_cc[0x12] = previousflags.c_cc[0x12];
        customflags.c_cc[0x13] = previousflags.c_cc[0x13];
        customflags.c_cc[0x14] = previousflags.c_cc[0x14];
        customflags.c_cc[0x15] = previousflags.c_cc[0x15];
        customflags.c_cc[0x16] = previousflags.c_cc[0x16];
        customflags.c_cc[0x17] = previousflags.c_cc[0x17];
        customflags.c_cc[0x18] = previousflags.c_cc[0x18];
        customflags.c_cc[0x19] = previousflags.c_cc[0x19];
        customflags.c_cc[0x1a] = previousflags.c_cc[0x1a];
        customflags.c_cc[0x1b] = previousflags.c_cc[0x1b];
        customflags.c_cc[0x1c] = previousflags.c_cc[0x1c];
        customflags.c_cc[0x1d] = previousflags.c_cc[0x1d];
        customflags.c_cc[0x1e] = previousflags.c_cc[0x1e];
        customflags.c_cc[0x1f] = previousflags.c_cc[0x1f];
        customflags._49_3_ = previousflags._49_3_;
        customflags.c_ispeed = previousflags.c_ispeed;
        customflags.c_ospeed = previousflags.c_ospeed;
        customflags._8_8_ = previousflags._8_8_ & 0xffffffb5ffffffff | 0x4000000000;
        *(undefined8 *)((long)pfVar20 + -8) = 0x103b5b;
        tcsetattr(0,0,(termios *)&customflags);
        uStack_150 = uVar16;
        if (uVar16 < uStack_100) {
          uStack_128 = (ulong)uStack_148;
          uStack_188 = (ulong)(uStack_148 * 0xe10);
          fStack_130 = (float)uStack_188;
          fStack_12c = (float)uStack_128;
          uStack_180 = (ulong)(uStack_148 * 0x3c);
          uVar23 = 0;
          uStack_f0 = 0;
          uVar26 = 0;
          do {
            bStack_b1 = 0;
            pcVar18 = ppcStack_d0[uVar16];
            uStack_120 = uVar16;
            uStack_d8 = uVar23;
            *(undefined8 *)((long)pfVar20 + -8) = 0x103be7;
            iVar12 = open(pcVar18,0);
            uStack_110 = uVar26;
            if (iVar12 != -1) {
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c07;
              __len = lseek(iVar12,0,2);
              if (__len == 0xffffffffffffffff) {
                *(undefined8 *)((long)pfVar20 + -8) = 0x104324;
                main_cold_11();
                goto LAB_00104324;
              }
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c2e;
              pcVar18 = (char *)mmap((void *)0x0,__len,1,1,iVar12,0);
              uVar16 = uStack_128;
              if (pcVar18 == (char *)0xffffffffffffffff) {
LAB_001043bc:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043c1;
                main_cold_10();
LAB_001043c1:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043c6;
                main_cold_9();
LAB_001043c6:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043d2;
                main_cold_2();
LAB_001043d2:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043d9;
                main_cold_8();
LAB_001043d9:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043e0;
                main_cold_5();
LAB_001043e0:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043e7;
                main_cold_6();
                pfVar27 = pfVar20;
LAB_001043e7:
                *(undefined8 *)((long)pfVar27 + -8) = 0x1043f3;
                main_cold_1();
                pfVar5 = pfVar27;
                goto LAB_001043f3;
              }
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c51;
              iVar13 = xm_create_context_safe(&pxStack_c0,pcVar18,__len,(uint32_t)uVar16);
              if (iVar13 != 0) {
                if (iVar13 != 1) {
                  if (iVar13 == 2) {
                    *(undefined8 *)((long)pfVar20 + -8) = 0x1043b5;
                    main_cold_3();
LAB_001043b5:
                    *(undefined8 *)((long)pfVar20 + -8) = 0x1043bc;
                    main_cold_7();
                    goto LAB_001043bc;
                  }
                  goto LAB_001043c1;
                }
                *(undefined8 *)((long)pfVar20 + -8) = 0x104347;
                main_cold_4();
              }
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c64;
              munmap(pcVar18,__len);
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c6b;
              close(iVar12);
              pxVar4 = pxStack_c0;
              if (pxStack_c0 == (xm_context_t *)0x0) goto LAB_00104324;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c81;
              xm_set_max_loop_count(pxVar4,(uint8_t)uVar34);
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c8a;
              uVar10 = xm_get_number_of_patterns(pxVar4);
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103c95;
              uVar11 = xm_get_number_of_channels(pxVar4);
              pxVar4 = pxStack_c0;
              uStack_e8 = CONCAT62(uStack_e8._2_6_,uVar11);
              *(undefined8 *)((long)pfVar20 + -8) = 0x103ca2;
              uStack_da = xm_get_module_length(pxVar4);
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103caf;
              xm_get_module_name(pxVar4);
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103cbb;
              pcVar18 = xm_get_tracker_name(pxVar4);
              *(undefined8 *)((long)pfVar20 + -8) = 0x103cd7;
              printf("==> Playing: %s\n");
              if (pcVar18 != (char *)0x0) {
                *(undefined8 *)((long)pfVar20 + -8) = 0x103ced;
                printf("==> Tracker: %s\n");
              }
              psStack_108 = psStack_168;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103cfd;
              iVar12 = snd_pcm_prepare();
              uVar23 = uStack_d8;
              psVar3 = psStack_108;
              uVar26 = uStack_110;
              if (iVar12 < 0) {
                *(undefined8 *)((long)pfVar20 + -8) = 0x103d19;
                iVar12 = snd_pcm_recover(psVar3,iVar12,0);
                if (iVar12 < 0) goto LAB_001043d2;
              }
              uStack_178 = uStack_e8 & 0xffff;
              uStack_134 = (uint)uStack_da;
              uStack_198 = (ulong)uVar10;
LAB_00103d40:
              pxVar4 = pxStack_c0;
              if (uVar34 != 0) {
                *(undefined8 *)((long)pfVar20 + -8) = 0x103d4e;
                bVar6 = xm_get_loop_count(pxVar4);
                if (uVar34 <= bVar6) goto switchD_00103e29_caseD_6e;
              }
              get_command_f._112_8_ = 0;
              get_command_f._120_8_ = 0;
              get_command_f._96_8_ = 0;
              get_command_f._104_8_ = 0;
              get_command_f._80_8_ = 0;
              get_command_f._88_8_ = 0;
              get_command_f._64_8_ = 0;
              get_command_f._72_8_ = 0;
              get_command_f._48_8_ = 0;
              get_command_f._56_8_ = 0;
              get_command_f._32_8_ = 0;
              get_command_f._40_8_ = 0;
              get_command_f._16_8_ = 0;
              get_command_f._24_8_ = 0;
              get_command_f._0_8_ = 0;
              get_command_f._8_8_ = 0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103da4;
              iVar13 = fileno(_stdin);
              *(undefined8 *)((long)pfVar20 + -8) = 0x103dc6;
              iVar15 = fileno(_stdin);
              iVar12 = iVar15 + 0x3f;
              if (-1 < iVar15) {
                iVar12 = iVar15;
              }
              *(ulong *)(get_command_f + (long)(iVar12 >> 6) * 8) =
                   *(ulong *)(get_command_f + (long)(iVar12 >> 6) * 8) | 1L << ((byte)iVar13 & 0x3f)
              ;
              get_command_t._0_8_ = 0;
              get_command_t._8_8_ = 0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103dfe;
              iVar12 = select(1,(fd_set *)get_command_f,(fd_set *)0x0,(fd_set *)0x0,
                              (timeval *)get_command_t);
              uVar16 = uVar23;
              if (iVar12 < 1) goto LAB_0010402f;
              *(undefined8 *)((long)pfVar20 + -8) = 0x103e0b;
              uVar14 = getchar();
              pxVar4 = pxStack_c0;
              psVar3 = psStack_108;
              if ((uVar14 & 0xff) < 0x3e) {
                if ((uVar14 & 0xff) == 0x20) {
                  uVar16 = uVar23 & 0xffffffff ^ 1;
                  if ((uVar23 & 1) != 0) {
                    uStack_f0 = (uint)CONCAT71((uint7)(uint3)(uVar14 >> 8),1);
                    uVar26 = 0;
                    goto LAB_0010402f;
                  }
                  *(undefined8 *)((long)pfVar20 + -8) = 0x103fdf;
                  iVar12 = snd_pcm_pause(psVar3,1);
                  if (iVar12 < 0) {
                    *(undefined8 *)((long)pfVar20 + -8) = 0x103feb;
                    iVar12 = snd_pcm_drain(psVar3);
                    if (iVar12 < 0) {
                      *(undefined8 *)((long)pfVar20 + -8) = 0x103ffb;
                      iVar12 = snd_pcm_recover(psVar3,iVar12,0);
                      if (iVar12 < 0) goto LAB_001043e0;
                    }
                  }
                  uStack_1ed = 0x2d;
                  _fStack_1f8 = 0x4150202d2d;
                  uStack_1f3 = 0x5355;
                  uStack_1f1 = 0x2d204445;
                  uVar26 = 0xffffffffffffffff;
                }
                else {
                  if ((uVar14 & 0xff) != 0x3c) goto switchD_00103e29_caseD_6d;
                  if (bStack_b1 != 0) {
                    if (uVar34 != 0) {
                      *(undefined8 *)((long)pfVar20 + -8) = 0x103e6b;
                      xm_set_max_loop_count(pxVar4,'\0');
                    }
                    pxVar4 = pxStack_c0;
                    uVar7 = bStack_b1 - 1;
                    *(undefined8 *)((long)pfVar20 + -8) = 0x103e80;
                    xm_seek(pxVar4,uVar7,'\0',0);
                    uVar34 = 0;
                  }
                }
                goto LAB_0010402f;
              }
              switch(uVar14 & 0xff) {
              case 0x6c:
                loopcnt = uVar34 == 0;
                uVar34 = (ulong)loopcnt;
                *(undefined8 *)((long)pfVar20 + -8) = 0x103e3e;
                xm_set_max_loop_count(pxVar4,loopcnt);
                break;
              case 0x6d:
              case 0x6f:
switchD_00103e29_caseD_6d:
                if ((byte)((char)uVar14 - 0x30U) < 10) {
                  channel = ((ushort)uVar14 & 0xff) - 0x2f;
                }
                else {
                  if (0x15 < (byte)((char)uVar14 + 0xbfU)) break;
                  channel = ((ushort)uVar14 & 0xff) - 0x36;
                }
                if (channel <= (ushort)uStack_e8) {
                  uStack_d8 = uVar23;
                  *(undefined8 *)((long)pfVar20 + -8) = 0x103f17;
                  _Var8 = xm_mute_channel(pxVar4,channel,true);
                  *(undefined8 *)((long)pfVar20 + -8) = 0x103f27;
                  xm_mute_channel(pxVar4,channel,!_Var8);
                  _fStack_1f8 = 0x6e6e616843;
                  uStack_1f3 = 0x6c65;
                  uStack_1f1 = 0x203a73;
                  if ((ushort)uStack_e8 != 0) {
                    uVar10 = 1;
                    uVar16 = 1;
                    do {
                      pxVar4 = pxStack_c0;
                      *(undefined8 *)((long)pfVar20 + -8) = 0x103f68;
                      _Var8 = xm_mute_channel(pxVar4,uVar10,true);
                      pxVar4 = pxStack_c0;
                      *(undefined8 *)((long)pfVar20 + -8) = 0x103f7a;
                      xm_mute_channel(pxVar4,uVar10,_Var8);
                      cVar9 = '.';
                      if (!_Var8) {
                        cVar9 = "Channels: "[(long)(int)uVar16 + 10];
                      }
                      *(char *)((long)&uStack_1f1 + uVar16 + 2) = cVar9;
                      uVar10 = uVar10 + 1;
                      uVar16 = (ulong)uVar10;
                    } while (uVar10 <= (ushort)uStack_e8);
                  }
                  *(undefined1 *)((long)&uStack_1f1 + uStack_178 + 3) = 0;
                  uVar26 = uStack_118 + uStack_128;
                  uVar16 = uStack_d8;
                }
                break;
              case 0x6e:
                goto switchD_00103e29_caseD_6e;
              case 0x70:
                if (uStack_120 == uStack_150) goto LAB_001043a4;
                uStack_120 = uStack_120 - 2;
switchD_00103e29_caseD_6e:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1042c7;
                putchar(10);
                psVar3 = psStack_108;
                *(undefined8 *)((long)pfVar20 + -8) = 0x1042d3;
                iVar12 = snd_pcm_drop(psVar3);
                if (iVar12 < 0) {
                  *(undefined8 *)((long)pfVar20 + -8) = 0x1042e3;
                  iVar12 = snd_pcm_recover(psVar3,iVar12,0);
                  if (iVar12 < 0) goto LAB_001043d9;
                }
                pxVar4 = pxStack_c0;
                *(undefined8 *)((long)pfVar20 + -8) = 0x1042f4;
                xm_free_context(pxVar4);
                goto LAB_001042f4;
              case 0x71:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043a4;
                putchar(10);
LAB_001043a4:
                *(undefined8 *)((long)pfVar20 + -8) = 0x1043ab;
                exit(0);
              default:
                if ((uVar14 & 0xff) != 0x3e) goto switchD_00103e29_caseD_6d;
                if (bStack_b1 < uStack_da) {
                  uVar7 = bStack_b1 + 1;
                  *(undefined8 *)((long)pfVar20 + -8) = 0x103ead;
                  xm_seek(pxVar4,uVar7,'\0',0);
                }
              }
LAB_0010402f:
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x10404b;
              xm_get_position(pxVar4,&bStack_b1,&bStack_c2,&bStack_c1,&uStack_118);
              pxVar4 = pxStack_c0;
              *(undefined8 *)((long)pfVar20 + -8) = 0x10405c;
              xm_get_playing_speed(pxVar4,&uStack_f4,&uStack_f2);
              pxVar4 = pxStack_c0;
              bVar6 = bStack_c2;
              if (uVar26 < uStack_118) {
                uStack_140 = (uint)uStack_f2;
                uStack_13c = (uint)uStack_f4;
                uStack_138 = (uint)bStack_b1;
                uStack_1a0 = (ulong)bStack_c1;
                uStack_110 = uVar26;
                *(undefined8 *)((long)pfVar20 + -8) = 0x1040a6;
                uVar10 = xm_get_number_of_rows(pxVar4,(ushort)bVar6);
                pxVar4 = pxStack_c0;
                *(undefined8 *)((long)pfVar20 + -8) = 0x1040b2;
                bVar6 = xm_get_loop_count(pxVar4);
                fVar35 = (float)uStack_118 / fStack_130;
                uVar24 = uStack_118 % uStack_188;
                uVar26 = uStack_180 & 0xffffffff;
                fVar36 = (float)(long)(uStack_118 % uStack_180) / fStack_12c;
                uVar30 = (ulong)uStack_140;
                uVar25 = (ulong)uStack_13c;
                uVar23 = (ulong)uStack_138;
                uVar33 = (ulong)uStack_134;
                uStack_1a8 = uVar34;
                uStack_d8 = uVar16;
                *(long *)((long)pfVar20 + -0x10) =
                     (long)(((float)(long)(uStack_118 % uStack_128) * 100.0) / fStack_12c);
                *(long *)((long)pfVar20 + -0x18) = (long)fVar36;
                *(long *)((long)pfVar20 + -0x20) = (long)(float)((uVar24 & 0xffffffff) / uVar26);
                *(long *)((long)pfVar20 + -0x28) = (long)fVar35;
                uVar34 = uStack_1a8;
                *(ulong *)((long)pfVar20 + -0x30) = uStack_1a8;
                *(ulong *)((long)pfVar20 + -0x38) = (ulong)bVar6;
                *(ulong *)((long)pfVar20 + -0x40) = (ulong)uVar10;
                *(ulong *)((long)pfVar20 + -0x48) = uStack_1a0;
                *(ulong *)((long)pfVar20 + -0x50) = uStack_198;
                *(undefined8 *)((long)pfVar20 + -0x58) = 0x1041de;
                printf("\rSpd[%.2X/%.2X] Pos[%.2X/%.2X] Pat[%.2X/%.2X] Row[%.2X/%.2X] Loop[%.2X/%.2lX] %.2i:%.2i:%.2i.%.2i\r"
                       ,uVar30,uVar25,uVar23,uVar33);
                uVar26 = uStack_110;
                uVar16 = uStack_d8;
              }
              else {
                *(undefined8 *)((long)pfVar20 + -8) = 0x1040ef;
                printf("\r%-*s\r",0x46,&fStack_1f8);
              }
              *(undefined8 *)((long)pfVar20 + -8) = 0x1041fc;
              fflush(_stdout);
              pxVar4 = pxStack_c0;
              pfVar27 = pfStack_158;
              sVar1 = sStack_160;
              uVar23 = uVar16;
              if ((uVar16 & 1) == 0) {
                *(undefined8 *)((long)pfVar20 + -8) = 0x104228;
                xm_generate_samples(pxVar4,pfVar27,sVar1);
                psVar3 = psStack_108;
                if ((uStack_f0 & 1) != 0) {
                  *(undefined8 *)((long)pfVar20 + -8) = 0x10423e;
                  snd_pcm_recover(psVar3,0,0);
                  *(undefined8 *)((long)pfVar20 + -8) = 0x104246;
                  iVar12 = snd_pcm_resume(psVar3);
                  if (iVar12 < 0) {
                    *(undefined8 *)((long)pfVar20 + -8) = 0x104252;
                    iVar12 = snd_pcm_prepare(psVar3);
                    if (iVar12 < 0) {
                      *(undefined8 *)((long)pfVar20 + -8) = 0x104262;
                      iVar12 = snd_pcm_recover(psVar3,iVar12,0);
                      if (iVar12 < 0) goto LAB_001043b5;
                    }
                  }
                }
                fVar35 = fStack_ec;
                sVar2 = sStack_144;
                pfVar27 = pfStack_158;
                sVar1 = sStack_160;
                alsabuffer = puStack_190;
                *(undefined8 *)((long)pfVar20 + -8) = 0x104292;
                play_floatbuffer(psVar3,sVar2,sVar1,fVar35,pfVar27,alsabuffer);
                uStack_f0 = 0;
              }
              else {
                *(undefined8 *)((long)pfVar20 + -8) = 0x10420c;
                usleep(10000);
              }
              goto LAB_00103d40;
            }
            *(undefined8 *)((long)pfVar20 + -8) = 0x104317;
            main_cold_12();
LAB_00104324:
            *(undefined8 *)((long)pfVar20 + -8) = 0x10432c;
            main_cold_13();
            uVar26 = uStack_110;
            uVar23 = uStack_d8;
LAB_001042f4:
            uVar16 = uStack_120 + 1;
          } while (uVar16 < uStack_100);
        }
        *(undefined8 *)((long)pfVar20 + -8) = 0x10435b;
        iVar12 = snd_pcm_close(psStack_168);
        if (-1 < iVar12) {
          return;
        }
        *(undefined8 *)((long)pfVar20 + -8) = 0x10436b;
        iVar12 = snd_pcm_recover(psStack_168,iVar12,0);
        if (-1 < iVar12) {
          return;
        }
        goto LAB_001043fb;
      }
    }
  }
LAB_001043f3:
  pfVar20 = pfVar5;
  *(undefined8 *)((long)pfVar20 + -8) = 0x1043fb;
  main_cold_15();
LAB_001043fb:
  *(code **)((long)pfVar20 + -8) = restoreterm;
  main_cold_14();
  tcsetattr(0,0,(termios *)&previousflags);
  return;
}

Assistant:

void init_alsa_device(int argc, char** argv,
                      size_t default_period_size,
                      size_t default_buffer_size,
                      int mode,
                      snd_pcm_t** out_device,
		      size_t* out_period_size,
		      unsigned int* out_rate,
                      snd_pcm_format_t* out_format) {
	snd_pcm_t* device;
	void* params;
	char* devicename = "default";
	size_t buffer_size = default_buffer_size;
	size_t period_size = default_period_size;
	const unsigned int channels = 2;
	unsigned int rate = 48000;
	snd_pcm_format_t format = SND_PCM_FORMAT_FLOAT;

	for(size_t i = 1; i < argc; ++i) {
		if(!strcmp(argv[i], "--")) {
			break;
		}

		if(!strcmp(argv[i], "--device")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			devicename = argv[i+1];
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--buffer-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			buffer_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--period-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			period_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--rate")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			rate = (unsigned int)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--format")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			++i;

			if(!strcmp(argv[i], "float")) {
				format = SND_PCM_FORMAT_FLOAT;
				continue;
			}

			if(!strcmp(argv[i], "s16")) {
				format = SND_PCM_FORMAT_S16;
				continue;
			}

			if(!strcmp(argv[i], "s32")) {
				format = SND_PCM_FORMAT_S32;
				continue;
			}

			FATAL("%s: unknown format %s\n", argv[0], argv[i]);
		}

		break;
	}

	CHECK_ALSA_CALL(snd_pcm_open(&device, devicename, SND_PCM_STREAM_PLAYBACK, mode));
	CHECK_ALSA_CALL(snd_pcm_hw_params_malloc((snd_pcm_hw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_hw_params_any(device, params));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED));

	if(snd_pcm_hw_params_set_format(device, params, format) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_FLOAT) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S32) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S16));
	}

	if(snd_pcm_hw_params_set_rate(device, params, rate, 0) < 0
	   && snd_pcm_hw_params_set_rate(device, params, rate = 48000, 0) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_rate(device, params, rate = 44100, 0));
	}

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_channels(device, params, channels));

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_buffer_size_near(device, params, &buffer_size));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_period_size_near(device, params, &period_size, 0));
	CHECK_ALSA_CALL(snd_pcm_hw_params(device, params));
	snd_pcm_hw_params_free(params);

	CHECK_ALSA_CALL(snd_pcm_sw_params_malloc((snd_pcm_sw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_sw_params_current(device, params));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_start_threshold(device, params, buffer_size - period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_avail_min(device, params, period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params(device, params));
	snd_pcm_sw_params_free(params);

	printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",
	       devicename,
	       format == SND_PCM_FORMAT_FLOAT ? "float" : (format == SND_PCM_FORMAT_S32 ? "s32" : "s16"),
	       rate,
	       period_size,
	       buffer_size
		);

	*out_device = device;
	*out_period_size = period_size;
	*out_rate = rate;
	*out_format = format;
}